

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  byte *pbVar1;
  uint uVar2;
  ExprList *pEVar3;
  sqlite3 *db;
  Parse *pParse_00;
  Expr *pEVar4;
  bool bVar5;
  bool bVar6;
  Select *pSVar7;
  int iVar8;
  Select *pSVar9;
  int iVar10;
  Expr *pEVar11;
  long lVar12;
  ExprList_item *pEVar13;
  Expr *pE;
  Expr *pEVar14;
  ulong uVar15;
  ExprList_item *pEVar16;
  Expr *p;
  int iVar17;
  long in_FS_OFFSET;
  int iCol;
  int local_4c;
  Token local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar3 = pSelect->pOrderBy;
  if (pEVar3 != (ExprList *)0x0) {
    db = pParse->db;
    uVar2 = pEVar3->nExpr;
    if (db->aLimit[2] < (int)uVar2) {
      sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
    }
    else {
      if (0 < (int)uVar2) {
        lVar12 = 0;
        do {
          pbVar1 = &pEVar3->a[0].fg.field_0x1 + lVar12;
          *pbVar1 = *pbVar1 & 0xfb;
          lVar12 = lVar12 + 0x18;
        } while ((ulong)uVar2 * 0x18 != lVar12);
      }
      pSelect->pNext = (Select *)0x0;
      pSVar9 = pSelect->pPrior;
      while (pSVar7 = pSVar9, pSVar7 != (Select *)0x0) {
        pSVar7->pNext = pSelect;
        pSelect = pSVar7;
        pSVar9 = pSVar7->pPrior;
      }
      bVar6 = true;
      do {
        if ((pSelect == (Select *)0x0) || (!bVar6)) {
          if ((long)pEVar3->nExpr < 1) goto LAB_00184bd6;
          uVar15 = 1;
          lVar12 = 0;
          goto LAB_00184bc4;
        }
        if (pEVar3->nExpr < 1) {
          bVar6 = false;
        }
        else {
          pParse_00 = (Parse *)pSelect->pEList;
          bVar6 = false;
          iVar17 = 0;
          pEVar16 = pEVar3->a;
          do {
            local_4c = -1;
            iVar10 = 0xb;
            if (((ulong)((anon_union_8_2_a01b6dbf_for_x *)&pEVar16->fg)->pList & 0x400) == 0) {
              p = pEVar16->pExpr;
              while ((p != (Expr *)0x0 && ((p->flags & 0x82000) != 0))) {
                if ((p->flags >> 0x13 & 1) == 0) {
                  if (p->op != 'r') break;
                  pEVar13 = (ExprList_item *)&p->pLeft;
                }
                else {
                  pEVar13 = ((p->x).pList)->a;
                }
                p = pEVar13->pExpr;
              }
              if (p == (Expr *)0x0) goto LAB_00184a2e;
              iVar10 = sqlite3ExprIsInteger(p,&local_4c,(Parse *)0x0);
              if (iVar10 == 0) {
                local_4c = resolveAsName(pParse_00,(ExprList *)p,pE);
                if (local_4c == 0) {
                  pEVar11 = exprDup(db,p,0,(EdupBuf *)0x0);
                  if (((db->mallocFailed == '\0') &&
                      (local_4c = resolveOrderByTermToExprList(pParse,pSelect,pEVar11),
                      1 < pParse->eParseMode)) && (0 < local_4c)) {
                    resolveOrderByTermToExprList(pParse,pSelect,p);
                  }
                  if (pEVar11 != (Expr *)0x0) {
                    sqlite3ExprDeleteNN(db,pEVar11);
                  }
                }
LAB_00184aad:
                iVar8 = local_4c;
                iVar10 = 0;
                bVar5 = true;
                if (local_4c < 1) {
                  bVar6 = true;
                }
                else {
                  if (pParse->eParseMode < 2) {
                    local_48.z = (char *)0x0;
                    local_48.n = 0;
                    local_48._12_4_ = 0xaaaaaaaa;
                    pEVar11 = sqlite3ExprAlloc(db,0x9c,&local_48,0);
                    if (pEVar11 == (Expr *)0x0) {
                      iVar10 = 1;
                      bVar5 = false;
                      goto LAB_00184b66;
                    }
                    pbVar1 = (byte *)((long)&pEVar11->flags + 1);
                    *pbVar1 = *pbVar1 | 8;
                    (pEVar11->u).iValue = iVar8;
                    pEVar13 = pEVar16;
                    pEVar4 = pEVar16->pExpr;
                    if (pEVar16->pExpr != p) {
                      do {
                        pEVar14 = pEVar4;
                        pEVar4 = pEVar14->pLeft;
                      } while (pEVar4->op == 'r');
                      pEVar13 = (ExprList_item *)&pEVar14->pLeft;
                    }
                    pEVar13->pExpr = pEVar11;
                    sqlite3ExprDeleteNN(db,p);
                    (pEVar16->u).x.iOrderByCol = (u16)local_4c;
                  }
                  pbVar1 = (byte *)((long)&pEVar16->fg + 1);
                  *pbVar1 = *pbVar1 | 4;
                }
              }
              else {
                if ((0 < local_4c) && (local_4c <= *(int *)&pParse_00->db)) goto LAB_00184aad;
                resolveOutOfRangeError(pParse,"ORDER",iVar17 + 1,*(int *)&pParse_00->db,p);
                iVar10 = 1;
                bVar5 = false;
              }
            }
            else {
LAB_00184a2e:
              bVar5 = false;
            }
LAB_00184b66:
            if ((iVar10 != 0xb) && (iVar10 != 0)) goto LAB_00184b9e;
            iVar17 = iVar17 + 1;
            pEVar16 = pEVar16 + 1;
          } while (iVar17 < pEVar3->nExpr);
        }
        pSelect = pSelect->pNext;
        bVar5 = true;
LAB_00184b9e:
      } while (bVar5);
    }
LAB_00184beb:
    iVar17 = 1;
    goto LAB_00184bf0;
  }
  goto LAB_00184bd6;
  while( true ) {
    uVar15 = (ulong)((int)uVar15 + 1);
    lVar12 = lVar12 + 0x18;
    if ((long)pEVar3->nExpr * 0x18 == lVar12) break;
LAB_00184bc4:
    if (((&pEVar3->a[0].fg.field_0x1)[lVar12] & 4) == 0) {
      sqlite3ErrorMsg(pParse,"%r ORDER BY term does not match any column in the result set",uVar15);
      goto LAB_00184beb;
    }
  }
LAB_00184bd6:
  iVar17 = 0;
LAB_00184bf0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar17;
  }
  __stack_chk_fail();
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].fg.done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->fg.done ) continue;
      pE = sqlite3ExprSkipCollateAndLikely(pItem->pExpr);
      if( NEVER(pE==0) ) continue;
      if( sqlite3ExprIsInteger(pE, &iCol, 0) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr, pE);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          /* Now test if expression pE matches one of the values returned
          ** by pSelect. In the usual case this is done by duplicating the
          ** expression, resolving any symbols in it, and then comparing
          ** it against each expression returned by the SELECT statement.
          ** Once the comparisons are finished, the duplicate expression
          ** is deleted.
          **
          ** If this is running as part of an ALTER TABLE operation and
          ** the symbols resolve successfully, also resolve the symbols in the
          ** actual expression. This allows the code in alter.c to modify
          ** column references within the ORDER BY expression as required.  */
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
            if( IN_RENAME_OBJECT && iCol>0 ){
              resolveOrderByTermToExprList(pParse, pSelect, pE);
            }
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists. */
        if( !IN_RENAME_OBJECT ){
          Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
          if( pNew==0 ) return 1;
          pNew->flags |= EP_IntValue;
          pNew->u.iValue = iCol;
          if( pItem->pExpr==pE ){
            pItem->pExpr = pNew;
          }else{
            Expr *pParent = pItem->pExpr;
            assert( pParent->op==TK_COLLATE );
            while( pParent->pLeft->op==TK_COLLATE ) pParent = pParent->pLeft;
            assert( pParent->pLeft==pE );
            pParent->pLeft = pNew;
          }
          sqlite3ExprDelete(db, pE);
          pItem->u.x.iOrderByCol = (u16)iCol;
        }
        pItem->fg.done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].fg.done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}